

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

int __thiscall Vector::copy(Vector *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  size_t in_RCX;
  size_t in_R8;
  Type *in_R9;
  Value local_80;
  Value local_70;
  Type *local_60;
  size_t i;
  uint8_t *base_dst;
  uint8_t *base_src;
  size_t element_size;
  Type *element_t;
  size_t count_local;
  size_t src_idx_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *src_ptr_local;
  size_t dst_idx_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dst_ptr_local;
  Vector *this_local;
  
  element_t = in_R9;
  count_local = in_R8;
  src_idx_local = in_RCX;
  src_ptr_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)src;
  dst_idx_local = (size_t)dst;
  dst_ptr_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  element_size = Typelib::Indirect::getIndirection();
  base_src = (uint8_t *)Typelib::Type::getSize();
  base_dst = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)src_idx_local,
                        count_local * (long)base_src);
  i = (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)dst_idx_local,
                         (long)src_ptr_local * (long)base_src);
  bVar1 = isElementMemcpy(this);
  if (bVar1) {
    if (dst_idx_local == src_idx_local) {
      local_60 = (Type *)memmove((void *)i,base_dst,(long)base_src * (long)element_t);
    }
    else {
      local_60 = (Type *)memcpy((void *)i,base_dst,(long)base_src * (long)element_t);
    }
  }
  else {
    for (local_60 = (Type *)0x0; local_60 < element_t; local_60 = local_60 + 1) {
      Typelib::Value::Value
                (&local_70,(void *)(i + (long)local_60 * (long)base_src),(Type *)element_size);
      Typelib::Value::Value
                (&local_80,base_dst + (long)local_60 * (long)base_src,(Type *)element_size);
      Typelib::copy(local_70,local_80);
    }
  }
  return (int)local_60;
}

Assistant:

void Vector::copy(std::vector<uint8_t>* dst_ptr, size_t dst_idx, std::vector<uint8_t>* src_ptr, size_t src_idx, size_t count) const
{
    Type const& element_t = getIndirection();
    size_t element_size = element_t.getSize();
    uint8_t* base_src = &(*src_ptr)[src_idx * element_size];
    uint8_t* base_dst = &(*dst_ptr)[dst_idx * element_size];
    if (isElementMemcpy())
    {
        if (dst_ptr == src_ptr)
            memmove(base_dst, base_src, element_size * count);
        else
            memcpy(base_dst, base_src, element_size * count);
    }
    else
    {
        for (size_t i = 0; i < count; ++i)
        {
            Typelib::copy(
                    Value(base_dst + i * element_size, element_t),
                    Value(base_src + i * element_size, element_t));
        }
    }
}